

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_floorf.c
# Opt level: O1

float wasm_floorf(float x)

{
  bool bVar1;
  float fVar2;
  byte bVar3;
  uint uVar4;
  
  uVar4 = (uint)x >> 0x17 & 0xff;
  fVar2 = x;
  if (uVar4 < 0x96) {
    if (uVar4 < 0x7f) {
      if ((0.0 < x + 1e+30) && (fVar2 = 0.0, (int)x < 0)) {
        bVar1 = NAN(x);
        if (x != 0.0) {
          x = -1.0;
        }
        fVar2 = x;
        if (bVar1) {
          fVar2 = -1.0;
        }
      }
    }
    else {
      bVar3 = (byte)(uVar4 - 0x7f);
      if ((((int)x << (bVar3 & 0x1f) & 0x7fffffU) != 0) && (0.0 < x + 1e+30)) {
        fVar2 = (float)(-0x800000 >> (bVar3 & 0x1f) &
                       ((int)x >> 0x1f & 0x800000U >> (bVar3 & 0x1f)) + (int)x);
      }
    }
  }
  else if (uVar4 - 0x7f == 0x80) {
    return x + x;
  }
  return fVar2;
}

Assistant:

float wasm_floorf(float x)
{
	int32_t i0,jj0;
	uint32_t i;

    GET_FLOAT_WORD(i0,x);

    jj0 = ((i0>>23)&0xff)-0x7f;
	if(jj0<23) {
	    if(jj0<0) { 	/* raise inexact if x != 0 */
		if(wasm_hugef+x>(float)0.0) {/* return 0*sign(x) if |x|<1 */
		    if(i0>=0) {i0=0;} 
		    else if((i0&0x7fffffff)!=0)
			{ i0=0xbf800000;}
		}
	    } else {
		i = (0x007fffff)>>jj0;
		if((i0&i)==0) return x; /* x is integral */
		if(wasm_hugef+x>(float)0.0) {	/* raise inexact flag */
		    if(i0<0) i0 += (0x00800000)>>jj0;
		    i0 &= (~i);
		}
	    }
	} else {
	    if(jj0==0x80) return x+x;	/* inf or NaN */
	    else return x;		/* x is integral */
	}
	SET_FLOAT_WORD(x,i0);
	return x;
}